

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

void __thiscall IDisk::SetWrite(IDisk *this,int side,uint track)

{
  MFMTrack *pMVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  ulong uVar4;
  MFMTrack *pMVar5;
  uchar *puVar6;
  MFMTrack *pMVar7;
  uint local_24;
  uint i;
  MFMTrack *tmp;
  uint track_local;
  int side_local;
  IDisk *this_local;
  
  if (this->side_[side].nb_tracks <= track) {
    pMVar1 = this->side_[side].tracks;
    auVar2 = ZEXT416(track + 1) * ZEXT816(0x20);
    uVar4 = auVar2._0_8_;
    if (auVar2._8_8_ != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pMVar5 = (MFMTrack *)operator_new__(uVar4);
    this->side_[side].tracks = pMVar5;
    memset(this->side_[side].tracks,0,(ulong)track * 0x20 + 1);
    for (local_24 = 0; local_24 < this->side_[side].nb_tracks; local_24 = local_24 + 1) {
      pMVar5 = this->side_[side].tracks + local_24;
      pMVar7 = pMVar1 + local_24;
      pMVar5->revolution = pMVar7->revolution;
      uVar3 = *(undefined4 *)&pMVar7->field_0xc;
      pMVar5->nb_revolutions = pMVar7->nb_revolutions;
      *(undefined4 *)&pMVar5->field_0xc = uVar3;
      pMVar5->bitfield = pMVar7->bitfield;
      uVar3 = *(undefined4 *)&pMVar7->field_0x1c;
      pMVar5->size = pMVar7->size;
      *(undefined4 *)&pMVar5->field_0x1c = uVar3;
    }
    if (pMVar1 != (MFMTrack *)0x0) {
      operator_delete__(pMVar1);
    }
    this->side_[side].nb_tracks = track + 1;
    this->disk_modified_ = true;
    puVar6 = (uchar *)operator_new__(0x40000);
    this->side_[side].tracks[track].bitfield = puVar6;
    this->side_[side].tracks[track].size = 0x40000;
    memset(this->side_[side].tracks[track].bitfield,0,0x40000);
    this->head_position_ = 0;
  }
  return;
}

Assistant:

void IDisk::SetWrite(int side, unsigned int track)
{
   // Set only one revolution here... And 6500 byte for this track.
   if (track >= side_[side].nb_tracks)
   {
      // Add a track !
      MFMTrack* tmp = side_[side].tracks;

      // Copy existing tracks
      side_[side].tracks = new MFMTrack[track + 1];
      memset(side_[side].tracks, 0, sizeof(MFMTrack) * track + 1);
      for (unsigned int i = 0; i < side_[side].nb_tracks; i++)
      {
         memcpy(&side_[side].tracks[i], &tmp[i], sizeof(MFMTrack));
      }

      // Delete old
      delete[]tmp;

      // Replace
      side_[side].nb_tracks = track + 1;

      disk_modified_ = true;
      side_[side].tracks[track].bitfield = new unsigned char [DEFAULT_TRACK_SIZE * 16];
      side_[side].tracks[track].size = DEFAULT_TRACK_SIZE * 16;
      memset(side_[side].tracks[track].bitfield, 0, DEFAULT_TRACK_SIZE * 16);

      head_position_ = 0;
   }
}